

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O1

void __thiscall
icu_63::TransliteratorRegistry::registerEntry
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant,TransliteratorEntry *adopted,UBool visible)

{
  UnicodeString s;
  UnicodeString ID;
  ConstChar16Ptr local_c8;
  UChar *local_c0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  icu_63::UnicodeString::UnicodeString(&local_b0,source);
  if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
    local_b0.fUnion.fFields.fLength = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (local_b0.fUnion.fFields.fLength == 0) {
    local_c8.p_ = L"Any";
    icu_63::UnicodeString::setTo(&local_b0,'\x01',&local_c8,3);
    local_c0 = local_c8.p_;
  }
  TransliteratorIDParser::STVtoID(source,target,variant,&local_70);
  registerEntry(this,&local_70,&local_b0,target,variant,adopted,visible);
  icu_63::UnicodeString::~UnicodeString(&local_b0);
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void TransliteratorRegistry::registerEntry(const UnicodeString& source,
                                           const UnicodeString& target,
                                           const UnicodeString& variant,
                                           TransliteratorEntry* adopted,
                                           UBool visible) {
    UnicodeString ID;
    UnicodeString s(source);
    if (s.length() == 0) {
        s.setTo(TRUE, ANY, 3);
    }
    TransliteratorIDParser::STVtoID(source, target, variant, ID);
    registerEntry(ID, s, target, variant, adopted, visible);
}